

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_print(char *str,size_t len)

{
  char cVar1;
  size_t in_RSI;
  osgen_txtwin_t *in_RDI;
  bool bVar2;
  size_t rem;
  char *startp;
  char *p;
  osgen_txtwin_t *win;
  int iVar3;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  osgen_txtwin_t *in_stack_ffffffffffffffe0;
  osgen_txtwin_t *poVar4;
  
  poVar4 = S_default_win;
  if (status_mode == 0) {
    if (os_f_plain == 0) {
      if (((S_default_win != (osgen_txtwin_t *)0x0) &&
          (ossaddsb(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,0)
          , S_deferred_redraw == 0)) && (((poVar4->base).flags & 4) == 0)) {
        ossloc(0,0x223be4);
      }
    }
    else {
      printf("%.*s",in_RSI & 0xffffffff,in_RDI);
    }
  }
  else if (((status_mode == 1) && (os_f_plain == 0)) && (S_status_win != (osgen_txtwin_t *)0x0)) {
    iVar3 = status_mode;
    if (((S_status_win->base).winy == 0) || (poVar4 = in_RDI, (S_status_win->base).winx == 0)) {
      while( true ) {
        bVar2 = false;
        if (in_RSI != 0) {
          bVar2 = (char)(in_RDI->base).win_type == '\n';
        }
        if (!bVar2) break;
        in_RDI = (osgen_txtwin_t *)((long)&(in_RDI->base).win_type + 1);
        in_RSI = in_RSI - 1;
      }
      if (in_RSI == 0) {
        return;
      }
      ossaddsb(in_RDI,in_stack_ffffffffffffffd8,in_RSI,1);
      poVar4 = in_RDI;
    }
    while( true ) {
      bVar2 = false;
      if (in_RSI != 0) {
        bVar2 = (char)(in_RDI->base).win_type != '\n';
      }
      if (!bVar2) break;
      cVar1 = (char)(in_RDI->base).win_type;
      if (cVar1 == '\x01') {
        in_RDI = (osgen_txtwin_t *)((long)&(in_RDI->base).win_type + 1);
        in_RSI = in_RSI - 1;
      }
      else if (cVar1 == '\x02') {
        in_RDI = (osgen_txtwin_t *)((long)&(in_RDI->base).win_type + 2);
        in_RSI = in_RSI - 2;
      }
      in_RDI = (osgen_txtwin_t *)((long)&(in_RDI->base).win_type + 1);
      in_RSI = in_RSI - 1;
    }
    ossaddsb(in_RDI,(char *)poVar4,in_RSI,iVar3);
    if ((char)(in_RDI->base).win_type == '\n') {
      os_status(0);
    }
  }
  return;
}

Assistant:

void os_print(const char *str, size_t len)
{
    osgen_txtwin_t *win;
    const char *p;
    const char *startp;
    size_t rem;

    /* determine what to do based on the status mode */
    switch(status_mode)
    {
    case 2:
        /* we're in the post-status-line mode - suppress all output */
        break; 
        
    case 0:
        /* we're showing the text in the default window */
        if (os_f_plain)
        {
            /* plain mode - simply write it to stdout */
            printf("%.*s", (int)len, str);
        }
        else
        {
            /* normal mode - write to the default window, if there is one */
            win = S_default_win;
            if (win != 0)
            {
                /* write the text to the window buffer */
                ossaddsb(win, str, len, TRUE);

                /* 
                 *   move the cursor to the new location, if we're not hiding
                 *   updates for the moment 
                 */
                if (!S_deferred_redraw
                    && !(win->base.flags & OSGEN_DEFER_REDRAW))
                    ossloc(win->base.winy + win->base.y - win->base.scrolly,
                           win->base.winx + win->base.x - win->base.scrollx);
            }
        }

        /* done */
        break;
        
    case 1:
        /* 
         *   Status line contents.  Ignore the status line in 'plain' mode
         *   or if there's no statusline window.  
         */
        if (os_f_plain || (win = S_status_win) == 0)
            break;

        /* 
         *   Skip leading newlines at the start of the statusline output.
         *   Only do this if we don't already have anything buffered, since
         *   a newline after some other text indicates the end of the status
         *   line and thus can't be ignored.  
         */
        p = str;
        rem = len;
        if (win->base.winy == 0 || win->base.winx == 0)
        {
            /* the buffer is empty, so skip leading newlines */
            for ( ; rem != 0 && *p == '\n' ; ++p, --rem) ;

            /* if that leaves nothing, we're done */
            if (rem == 0)
                break;

            /* 
             *   add a space before the first character, so that we always
             *   have a space at the left edge of the status line 
             */
            ossaddsb(win, " ", 1, TRUE);
        }

        /* scan for a newline; if we find one, it's the end of the status */
        for (startp = p ; rem != 0 && *p != '\n' ; ++p, --rem)
        {
            /* skip escapes */
            switch (*p)
            {
            case OSGEN_ATTR:
                /* skip the extra byte */
                p += 1;
                rem -= 1;
                break;
                
            case OSGEN_COLOR:
                /* skip the extra two bytes */
                p += 2;
                rem -= 2;
                break;

            default:
                /* everything else is one byte long */
                break;
            }
        }

        /* add this text to the statusline window */
        ossaddsb(win, startp, p - startp, TRUE);

        /* finish up if we found a newline */
        if (*p == '\n')
        {
            /* switch to status mode 2 */
            os_status(2);
        }
        
        /* done */
        break;
    }
}